

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall pbrt::Vertex::Vertex(Vertex *this,MediumInteraction *mi,SampledSpectrum *beta)

{
  undefined8 *in_RDX;
  MediumInteraction *in_RDI;
  MediumInteraction *in_stack_ffffffffffffffd8;
  
  (in_RDI->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 4.2039e-45;
  *(undefined8 *)
   &(in_RDI->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = *in_RDX;
  *(undefined8 *)
   &(in_RDI->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = in_RDX[1];
  MediumInteraction::MediumInteraction(in_RDI,in_stack_ffffffffffffffd8);
  BSDF::BSDF((BSDF *)in_RDI);
  *(undefined1 *)&in_RDI[2].super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0;
  in_RDI[2].super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  in_RDI[2].super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  return;
}

Assistant:

Vertex(const MediumInteraction &mi, const SampledSpectrum &beta)
        : type(VertexType::Medium), beta(beta), mi(mi) {}